

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::setContent
          (QWidgetTextControlPrivate *this,TextFormat format,QString *text,QTextDocument *document)

{
  QTextDocument *pQVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  QObject *pQVar5;
  QTextDocument *in_RCX;
  QFlags_conflict1 *in_RDX;
  int in_ESI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  bool previousUndoRedoState;
  bool clearDocument;
  QWidgetTextControl *q;
  QTextCursor formatCursor;
  QTextCharFormat charFormatForInsertion;
  QPalette *in_stack_fffffffffffffd68;
  ulong uVar6;
  QWidgetTextControlPrivate *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  offset_in_QWidgetTextControl_to_subr in_stack_fffffffffffffd90;
  code *pcVar7;
  code *slot;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 uVar8;
  undefined8 in_stack_fffffffffffffdc0;
  ConnectionType type;
  Object *sender;
  Object *in_stack_fffffffffffffdc8;
  QWidgetTextControlPrivate *in_stack_fffffffffffffdd0;
  QTextDocument *in_stack_fffffffffffffde0;
  Function in_stack_fffffffffffffdf0;
  code *in_stack_fffffffffffffe00;
  Connection local_128;
  Connection local_120;
  QTextCursor local_118 [16];
  undefined1 *local_108;
  QTextCursor local_100 [8];
  QMetaMethod local_f8;
  QMetaMethod local_e8;
  code *local_d8;
  undefined8 local_d0;
  Connection local_c8;
  code *local_c0;
  undefined8 local_b8;
  Connection local_b0;
  code *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined1 local_80 [16];
  undefined8 uStack_70;
  Object local_68 [8];
  code *local_60;
  undefined8 uStack_58;
  Connection local_50;
  code *local_48;
  undefined8 uStack_40;
  Connection local_38;
  QTextCursor local_30 [8];
  QPalette local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  QTextDocument *local_8;
  
  type = (ConnectionType)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  local_8 = *(QTextDocument **)(in_FS_OFFSET + 0x28);
  pQVar5 = (QObject *)q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  bVar2 = true;
  if (in_RDI->doc == (QTextDocument *)0x0) {
    if (in_RCX == (QTextDocument *)0x0) {
      QApplication::palette(in_stack_fffffffffffffd78);
      QPalette::operator=((QPalette *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      QPalette::~QPalette(&local_28);
      in_stack_fffffffffffffde0 = (QTextDocument *)operator_new(0x10);
      QTextDocument::QTextDocument(in_stack_fffffffffffffde0,pQVar5);
      in_RDI->doc = in_stack_fffffffffffffde0;
    }
    else {
      in_RDI->doc = in_RCX;
    }
    bVar2 = false;
    _q_documentLayoutChanged(in_stack_fffffffffffffdd0);
    pcVar7 = _q_documentLayoutChanged;
    QTextCursor::QTextCursor(local_30,in_RDI->doc);
    QTextCursor::operator=
              ((QTextCursor *)in_stack_fffffffffffffd70,(QTextCursor *)in_stack_fffffffffffffd68);
    QTextCursor::~QTextCursor(local_30);
    local_48 = _q_updateCurrentCharFormatAndSelection;
    uStack_40 = 0;
    uVar8 = 0;
    QObjectPrivate::connect<void(QTextDocument::*)(),void(QWidgetTextControlPrivate::*)()>
              ((Object *)in_stack_fffffffffffffdd0,
               (offset_in_QTextDocument_to_subr)in_stack_fffffffffffffe00,in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdf0,type);
    QMetaObject::Connection::~Connection(&local_38);
    local_60 = _q_emitCursorPosChanged;
    uStack_58 = 0;
    QObjectPrivate::
    connect<void(QTextDocument::*)(QTextCursor_const&),void(QWidgetTextControlPrivate::*)(QTextCursor_const&)>
              ((Object *)in_stack_fffffffffffffdd0,
               (offset_in_QTextDocument_to_subr)in_stack_fffffffffffffe00,in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdf0,type);
    QMetaObject::Connection::~Connection(&local_50);
    uStack_70 = 0;
    in_stack_fffffffffffffd70 = (QWidgetTextControlPrivate *)0x0;
    sender = local_68;
    slot = pcVar7;
    local_80._8_8_ = pcVar7;
    QObjectPrivate::connect<void(QTextDocument::*)(),void(QWidgetTextControlPrivate::*)()>
              ((Object *)in_stack_fffffffffffffdd0,
               (offset_in_QTextDocument_to_subr)in_stack_fffffffffffffe00,in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdf0,(ConnectionType)((ulong)sender >> 0x20));
    QMetaObject::Connection::~Connection((Connection *)sender);
    local_98._8_8_ = QWidgetTextControl::undoAvailable;
    local_88 = 0;
    uVar6 = (ulong)pcVar7 & 0xffffffff00000000;
    in_stack_fffffffffffffdc8 = (Object *)local_80;
    QObject::connect<void(QTextDocument::*)(bool),void(QWidgetTextControl::*)(bool)>
              (sender,(offset_in_QTextDocument_to_subr)in_stack_fffffffffffffde0,
               (ContextType *)CONCAT44(uVar8,in_stack_fffffffffffffdb8),
               (offset_in_QWidgetTextControl_to_subr *)slot,
               (ConnectionType)in_stack_fffffffffffffe00);
    QMetaObject::Connection::~Connection((Connection *)in_stack_fffffffffffffdc8);
    local_a8 = QWidgetTextControl::redoAvailable;
    local_a0 = 0;
    uVar6 = uVar6 & 0xffffffff00000000;
    in_stack_fffffffffffffdd0 = (QWidgetTextControlPrivate *)local_98;
    QObject::connect<void(QTextDocument::*)(bool),void(QWidgetTextControl::*)(bool)>
              (sender,(offset_in_QTextDocument_to_subr)in_stack_fffffffffffffde0,
               (ContextType *)CONCAT44(uVar8,in_stack_fffffffffffffdb8),
               (offset_in_QWidgetTextControl_to_subr *)slot,
               (ConnectionType)in_stack_fffffffffffffe00);
    QMetaObject::Connection::~Connection((Connection *)in_stack_fffffffffffffdd0);
    local_c0 = QWidgetTextControl::modificationChanged;
    local_b8 = 0;
    uVar6 = uVar6 & 0xffffffff00000000;
    QObject::connect<void(QTextDocument::*)(bool),void(QWidgetTextControl::*)(bool)>
              (sender,(offset_in_QTextDocument_to_subr)in_stack_fffffffffffffde0,
               (ContextType *)CONCAT44(uVar8,in_stack_fffffffffffffdb8),
               (offset_in_QWidgetTextControl_to_subr *)slot,
               (ConnectionType)in_stack_fffffffffffffe00);
    QMetaObject::Connection::~Connection(&local_b0);
    local_d8 = QWidgetTextControl::blockCountChanged;
    local_d0 = 0;
    in_stack_fffffffffffffd68 = (QPalette *)(uVar6 & 0xffffffff00000000);
    QObject::connect<void(QTextDocument::*)(int),void(QWidgetTextControl::*)(int)>
              (sender,(offset_in_QTextDocument_to_subr)in_stack_fffffffffffffde0,
               (ContextType *)CONCAT44(uVar8,in_stack_fffffffffffffdb8),
               (offset_in_QWidgetTextControl_to_subr *)slot,
               (ConnectionType)in_stack_fffffffffffffe00);
    type = (ConnectionType)((ulong)sender >> 0x20);
    QMetaObject::Connection::~Connection(&local_c8);
  }
  QTextDocument::isUndoRedoEnabled();
  if (in_RCX == (QTextDocument *)0x0) {
    QTextDocument::setUndoRedoEnabled(SUB81(in_RDI->doc,0));
  }
  if ((setContent(Qt::TextFormat,QString_const&,QTextDocument*)::contentsChangedIndex == '\0') &&
     (iVar4 = __cxa_guard_acquire(&setContent(Qt::TextFormat,QString_const&,QTextDocument*)::
                                   contentsChangedIndex), iVar4 != 0)) {
    local_e8 = QMetaMethod::fromSignal<void(QTextDocument::*)()>(in_stack_fffffffffffffd90);
    setContent::contentsChangedIndex = QMetaMethod::methodIndex();
    __cxa_guard_release(&setContent(Qt::TextFormat,QString_const&,QTextDocument*)::
                         contentsChangedIndex);
  }
  if ((setContent(Qt::TextFormat,QString_const&,QTextDocument*)::textChangedIndex == '\0') &&
     (iVar4 = __cxa_guard_acquire(&setContent(Qt::TextFormat,QString_const&,QTextDocument*)::
                                   textChangedIndex), iVar4 != 0)) {
    in_stack_fffffffffffffe00 = QWidgetTextControl::textChanged;
    local_f8 = QMetaMethod::fromSignal<void(QWidgetTextControl::*)()>(in_stack_fffffffffffffd90);
    setContent::textChangedIndex = QMetaMethod::methodIndex();
    __cxa_guard_release(&setContent(Qt::TextFormat,QString_const&,QTextDocument*)::textChangedIndex)
    ;
  }
  QMetaObject::disconnect
            ((QObject *)in_RDI->doc,setContent::contentsChangedIndex,pQVar5,
             setContent::textChangedIndex);
  bVar3 = QString::isEmpty((QString *)0x710cf7);
  if (bVar3) {
    if (bVar2) {
      (**(code **)(*(long *)in_RDI->doc + 0x60))();
    }
  }
  else {
    QTextCursor::QTextCursor(local_100);
    QTextCursor::operator=
              ((QTextCursor *)in_stack_fffffffffffffd70,(QTextCursor *)in_stack_fffffffffffffd68);
    QTextCursor::~QTextCursor(local_100);
    if (in_ESI == 0) {
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::QTextCursor((QTextCursor *)&local_108,in_RDI->doc);
      QTextCursor::beginEditBlock();
      QTextDocument::setPlainText((QString *)in_RDI->doc);
      QTextDocument::setUndoRedoEnabled(SUB81(in_RDI->doc,0));
      QTextCursor::select((SelectionType)&local_108);
      QTextCursor::setCharFormat((QTextCharFormat *)&local_108);
      QTextCursor::endEditBlock();
      QTextCursor::~QTextCursor((QTextCursor *)&local_108);
    }
    else if (in_ESI == 3) {
      pQVar1 = in_RDI->doc;
      QFlags<QTextDocument::MarkdownFeature>::QFlags
                ((QFlags<QTextDocument::MarkdownFeature> *)in_stack_fffffffffffffd70,
                 (MarkdownFeature)((ulong)in_stack_fffffffffffffd68 >> 0x20));
      QTextDocument::setMarkdown((QString *)pQVar1,in_RDX);
      QTextDocument::setUndoRedoEnabled(SUB81(in_RDI->doc,0));
    }
    else {
      QTextDocument::setHtml((QString *)in_RDI->doc);
      QTextDocument::setUndoRedoEnabled(SUB81(in_RDI->doc,0));
    }
    QTextCursor::QTextCursor(local_118,in_RDI->doc);
    QTextCursor::operator=
              ((QTextCursor *)in_stack_fffffffffffffd70,(QTextCursor *)in_stack_fffffffffffffd68);
    QTextCursor::~QTextCursor(local_118);
  }
  QTextCursor::setCharFormat((QTextCharFormat *)&in_RDI->cursor);
  QMetaObject::connect
            ((QObject *)&local_120,(int)in_RDI->doc,
             (QObject *)(ulong)(uint)setContent::contentsChangedIndex,(int)pQVar5,
             setContent::textChangedIndex,(int *)0x0);
  QMetaObject::Connection::~Connection(&local_120);
  QWidgetTextControl::textChanged((QWidgetTextControl *)0x710f50);
  if (in_RCX == (QTextDocument *)0x0) {
    QTextDocument::setUndoRedoEnabled(SUB81(in_RDI->doc,0));
  }
  _q_updateCurrentCharFormatAndSelection(in_stack_fffffffffffffd70);
  if (in_RCX == (QTextDocument *)0x0) {
    QTextDocument::setModified(SUB81(in_RDI->doc,0));
  }
  (**(code **)(*(long *)pQVar5 + 0x60))();
  QWidgetTextControl::cursorPositionChanged((QWidgetTextControl *)0x710fc1);
  QObjectPrivate::
  connect<void(QTextDocument::*)(int,int,int),void(QWidgetTextControlPrivate::*)(int,int,int)>
            ((Object *)in_stack_fffffffffffffdd0,
             (offset_in_QTextDocument_to_subr)in_stack_fffffffffffffe00,in_stack_fffffffffffffdc8,
             (Function)QTextDocument::contentsChange,type);
  QMetaObject::Connection::~Connection(&local_128);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x711050);
  if (*(QTextDocument **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::setContent(Qt::TextFormat format, const QString &text, QTextDocument *document)
{
    Q_Q(QWidgetTextControl);

    // for use when called from setPlainText. we may want to re-use the currently
    // set char format then.
    const QTextCharFormat charFormatForInsertion = cursor.charFormat();

    bool clearDocument = true;
    if (!doc) {
        if (document) {
            doc = document;
        } else {
            palette = QApplication::palette("QWidgetTextControl");
            doc = new QTextDocument(q);
        }
        clearDocument = false;
        _q_documentLayoutChanged();
        cursor = QTextCursor(doc);

// ####        doc->documentLayout()->setPaintDevice(viewport);

        QObjectPrivate::connect(doc, &QTextDocument::contentsChanged, this,
                                &QWidgetTextControlPrivate::_q_updateCurrentCharFormatAndSelection);
        QObjectPrivate::connect(doc, &QTextDocument::cursorPositionChanged, this,
                                &QWidgetTextControlPrivate::_q_emitCursorPosChanged);
        QObjectPrivate::connect(doc, &QTextDocument::documentLayoutChanged, this,
                                &QWidgetTextControlPrivate::_q_documentLayoutChanged);

        // convenience signal forwards
        QObject::connect(doc, &QTextDocument::undoAvailable, q, &QWidgetTextControl::undoAvailable);
        QObject::connect(doc, &QTextDocument::redoAvailable, q, &QWidgetTextControl::redoAvailable);
        QObject::connect(doc, &QTextDocument::modificationChanged, q,
                         &QWidgetTextControl::modificationChanged);
        QObject::connect(doc, &QTextDocument::blockCountChanged, q,
                         &QWidgetTextControl::blockCountChanged);
    }

    bool previousUndoRedoState = doc->isUndoRedoEnabled();
    if (!document)
        doc->setUndoRedoEnabled(false);

    //Saving the index save some time.
    static int contentsChangedIndex = QMetaMethod::fromSignal(&QTextDocument::contentsChanged).methodIndex();
    static int textChangedIndex = QMetaMethod::fromSignal(&QWidgetTextControl::textChanged).methodIndex();
    // avoid multiple textChanged() signals being emitted
    QMetaObject::disconnect(doc, contentsChangedIndex, q, textChangedIndex);

    if (!text.isEmpty()) {
        // clear 'our' cursor for insertion to prevent
        // the emission of the cursorPositionChanged() signal.
        // instead we emit it only once at the end instead of
        // at the end of the document after loading and when
        // positioning the cursor again to the start of the
        // document.
        cursor = QTextCursor();
        if (format == Qt::PlainText) {
            QTextCursor formatCursor(doc);
            // put the setPlainText and the setCharFormat into one edit block,
            // so that the syntax highlight triggers only /once/ for the entire
            // document, not twice.
            formatCursor.beginEditBlock();
            doc->setPlainText(text);
            doc->setUndoRedoEnabled(false);
            formatCursor.select(QTextCursor::Document);
            formatCursor.setCharFormat(charFormatForInsertion);
            formatCursor.endEditBlock();
#if QT_CONFIG(textmarkdownreader)
        } else if (format == Qt::MarkdownText) {
            doc->setMarkdown(text);
            doc->setUndoRedoEnabled(false);
#endif
        } else {
#ifndef QT_NO_TEXTHTMLPARSER
            doc->setHtml(text);
#else
            doc->setPlainText(text);
#endif
            doc->setUndoRedoEnabled(false);
        }
        cursor = QTextCursor(doc);
    } else if (clearDocument) {
        doc->clear();
    }
    cursor.setCharFormat(charFormatForInsertion);

    QMetaObject::connect(doc, contentsChangedIndex, q, textChangedIndex);
    emit q->textChanged();
    if (!document)
        doc->setUndoRedoEnabled(previousUndoRedoState);
    _q_updateCurrentCharFormatAndSelection();
    if (!document)
        doc->setModified(false);

    q->ensureCursorVisible();
    emit q->cursorPositionChanged();

    QObjectPrivate::connect(doc, &QTextDocument::contentsChange, this,
                            &QWidgetTextControlPrivate::_q_contentsChanged, Qt::UniqueConnection);
}